

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

IncorrectConstruction *
CLI::IncorrectConstruction::ChangeNotVector
          (IncorrectConstruction *__return_storage_ptr__,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *name_local;
  
  local_18 = name;
  name_local = (string *)__return_storage_ptr__;
  ::std::operator+(&local_38,name,": You can only change the expected arguments for vectors");
  IncorrectConstruction(__return_storage_ptr__,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static IncorrectConstruction ChangeNotVector(std::string name) {
        return IncorrectConstruction(name + ": You can only change the expected arguments for vectors");
    }